

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O3

uint m68k_disassemble_raw(char *str_buff,uint pc,uchar *opdata,uchar *argdata,uint cpu_type)

{
  uint uVar1;
  
  g_rawop = opdata;
  g_rawbasepc = pc;
  uVar1 = m68k_disassemble(str_buff,pc,cpu_type);
  g_rawop = (uchar *)0x0;
  return uVar1;
}

Assistant:

unsigned int m68k_disassemble_raw(char* str_buff, unsigned int pc, const unsigned char* opdata, const unsigned char* argdata, unsigned int cpu_type)
{
	unsigned int result;
	(void)argdata;

	g_rawop = opdata;
	g_rawbasepc = pc;
	result = m68k_disassemble(str_buff, pc, cpu_type);
	g_rawop = NULL;
	return result;
}